

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::DynamicState(DynamicState *this,DynamicState *other)

{
  uint uVar1;
  VkDynamicState *__first;
  allocator_type local_31;
  _Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_30;
  
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dynamicStates).
  super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       (other->super_VkPipelineDynamicStateCreateInfo).sType;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext =
       (other->super_VkPipelineDynamicStateCreateInfo).pNext;
  (this->super_VkPipelineDynamicStateCreateInfo).flags =
       (other->super_VkPipelineDynamicStateCreateInfo).flags;
  uVar1 = (other->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount;
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount = uVar1;
  __first = (other->super_VkPipelineDynamicStateCreateInfo).pDynamicStates;
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            ((vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> *)&local_30,__first,
             __first + uVar1,&local_31);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::_M_move_assign
            (&this->m_dynamicStates,&local_30);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            (&local_30);
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates =
       (this->m_dynamicStates).
       super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  return;
}

Assistant:

PipelineCreateInfo::DynamicState::DynamicState (const DynamicState &other)
{
	sType = other.sType;
	pNext = other.pNext;

	flags				= other.flags;
	dynamicStateCount	= other.dynamicStateCount;
	m_dynamicStates		= std::vector<vk::VkDynamicState>(other.pDynamicStates, other.pDynamicStates + dynamicStateCount);
	pDynamicStates		= &m_dynamicStates[0];
}